

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v11::detail::bigint::square(bigint *this)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  size_t sVar4;
  uint *puVar5;
  buffer<unsigned_int> *in_RDI;
  ulong uVar6;
  bool bVar7;
  int i_1;
  int j_1;
  int bigit_index_1;
  int j;
  int i;
  int bigit_index;
  uint128_t sum;
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_> n;
  int num_result_bigits;
  int num_bigits;
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>
  *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  bigint *in_stack_fffffffffffffec0;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  ulong local_d8;
  ulong local_d0;
  buffer<unsigned_int> local_b0 [5];
  int local_10;
  int local_c;
  
  sVar4 = buffer<unsigned_int>::size(in_RDI);
  local_c = (int)sVar4;
  local_10 = local_c * 2;
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::
  basic_memory_buffer((basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>
                       *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                      in_stack_fffffffffffffea8);
  to_unsigned<int>(0);
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::resize
            ((basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (size_t)in_stack_fffffffffffffea8);
  local_d0 = 0;
  local_d8 = 0;
  for (local_dc = 0; local_dc < local_c; local_dc = local_dc + 1) {
    local_e0 = 0;
    for (local_e4 = local_dc; -1 < local_e4; local_e4 = local_e4 + -1) {
      puVar5 = buffer<unsigned_int>::operator[]<int>(local_b0,local_e0);
      uVar3 = *puVar5;
      puVar5 = buffer<unsigned_int>::operator[]<int>(local_b0,local_e4);
      bVar7 = CARRY8(local_d8,(ulong)uVar3 * (ulong)*puVar5);
      local_d8 = local_d8 + (ulong)uVar3 * (ulong)*puVar5;
      local_d0 = local_d0 + bVar7;
      local_e0 = local_e0 + 1;
    }
    puVar5 = buffer<unsigned_int>::operator[]<int>(in_RDI,local_dc);
    *puVar5 = (uint)local_d8;
    uVar3 = num_bits<unsigned_int>();
    uVar6 = local_d0 >> ((byte)uVar3 & 0x3f);
    bVar1 = (byte)uVar3 & 0x3f;
    uVar2 = local_d0 << 0x40 - bVar1;
    local_d0 = uVar6;
    local_d8 = local_d8 >> bVar1 | uVar2;
    if ((uVar3 & 0x40) != 0) {
      local_d0 = 0;
      local_d8 = uVar6;
    }
  }
  for (local_e8 = local_c; local_e8 < local_10; local_e8 = local_e8 + 1) {
    local_f0 = local_e8 - (local_c + -1);
    local_ec = local_c + -1;
    while (local_f0 < local_c) {
      puVar5 = buffer<unsigned_int>::operator[]<int>(local_b0,local_f0);
      in_stack_fffffffffffffec0 = (bigint *)(ulong)*puVar5;
      puVar5 = buffer<unsigned_int>::operator[]<int>(local_b0,local_ec);
      bVar7 = CARRY8(local_d8,(long)in_stack_fffffffffffffec0 * (ulong)*puVar5);
      local_d8 = local_d8 + (long)in_stack_fffffffffffffec0 * (ulong)*puVar5;
      local_d0 = local_d0 + bVar7;
      local_f0 = local_f0 + 1;
      local_ec = local_ec + -1;
    }
    uVar3 = (uint)local_d8;
    puVar5 = buffer<unsigned_int>::operator[]<int>(in_RDI,local_e8);
    *puVar5 = uVar3;
    uVar3 = num_bits<unsigned_int>();
    uVar6 = local_d0 >> ((byte)uVar3 & 0x3f);
    bVar1 = (byte)uVar3 & 0x3f;
    uVar2 = local_d0 << 0x40 - bVar1;
    local_d0 = uVar6;
    local_d8 = local_d8 >> bVar1 | uVar2;
    if ((uVar3 & 0x40) != 0) {
      local_d0 = 0;
      local_d8 = uVar6;
    }
  }
  remove_leading_zeros(in_stack_fffffffffffffec0);
  *(int *)&in_RDI[5].ptr_ = *(int *)&in_RDI[5].ptr_ << 1;
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::
  ~basic_memory_buffer
            ((basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_> *)
             0x360129);
  return;
}

Assistant:

FMT_CONSTEXPR20 void square() {
    int num_bigits = static_cast<int>(bigits_.size());
    int num_result_bigits = 2 * num_bigits;
    basic_memory_buffer<bigit, bigits_capacity> n(std::move(bigits_));
    bigits_.resize(to_unsigned(num_result_bigits));
    auto sum = uint128_t();
    for (int bigit_index = 0; bigit_index < num_bigits; ++bigit_index) {
      // Compute bigit at position bigit_index of the result by adding
      // cross-product terms n[i] * n[j] such that i + j == bigit_index.
      for (int i = 0, j = bigit_index; j >= 0; ++i, --j) {
        // Most terms are multiplied twice which can be optimized in the future.
        sum += double_bigit(n[i]) * n[j];
      }
      bigits_[bigit_index] = static_cast<bigit>(sum);
      sum >>= num_bits<bigit>();  // Compute the carry.
    }
    // Do the same for the top half.
    for (int bigit_index = num_bigits; bigit_index < num_result_bigits;
         ++bigit_index) {
      for (int j = num_bigits - 1, i = bigit_index - j; i < num_bigits;)
        sum += double_bigit(n[i++]) * n[j--];
      bigits_[bigit_index] = static_cast<bigit>(sum);
      sum >>= num_bits<bigit>();
    }
    remove_leading_zeros();
    exp_ *= 2;
  }